

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O0

FeatureOptions<wasm::BinaryOp> * __thiscall
wasm::Random::FeatureOptions<wasm::BinaryOp>::
add<wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp>
          (FeatureOptions<wasm::BinaryOp> *this,FeatureSet feature,BinaryOp option,BinaryOp rest,
          BinaryOp rest_1,BinaryOp rest_2,BinaryOp rest_3,BinaryOp rest_4,BinaryOp rest_5,
          BinaryOp rest_6,BinaryOp rest_7,BinaryOp rest_8,BinaryOp rest_9,BinaryOp rest_10,
          BinaryOp rest_11,BinaryOp rest_12,BinaryOp rest_13,BinaryOp rest_14)

{
  mapped_type *this_00;
  FeatureOptions<wasm::BinaryOp> *pFVar1;
  BinaryOp rest_local_2;
  BinaryOp rest_local_1;
  BinaryOp rest_local;
  BinaryOp option_local;
  FeatureOptions<wasm::BinaryOp> *this_local;
  FeatureSet feature_local;
  
  rest_local_1 = option;
  _rest_local = this;
  this_local._4_4_ = feature.features;
  this_00 = std::
            map<wasm::FeatureSet,_std::vector<wasm::BinaryOp,_std::allocator<wasm::BinaryOp>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::BinaryOp,_std::allocator<wasm::BinaryOp>_>_>_>_>
            ::operator[](&this->options,(key_type *)((long)&this_local + 4));
  std::vector<wasm::BinaryOp,_std::allocator<wasm::BinaryOp>_>::push_back(this_00,&rest_local_1);
  pFVar1 = add<wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp>
                     (this,this_local._4_4_,rest,rest_1,rest_2,rest_3,rest_4,rest_5,rest_6,rest_7,
                      rest_8,rest_9,rest_10,rest_11,rest_12,rest_13,rest_14);
  return pFVar1;
}

Assistant:

FeatureOptions<T>& add(FeatureSet feature, T option, Ts... rest) {
      options[feature].push_back(option);
      return add(feature, rest...);
    }